

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

string * __thiscall
node::(anonymous_namespace)::ExternalSignerImpl::getName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,*(long *)((long)this + 0x68),
                   *(long *)((long)this + 0x70) + *(long *)((long)this + 0x68));
}

Assistant:

std::string getName() override { return m_signer.m_name; }